

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lex.hpp
# Opt level: O0

bool __thiscall
cfgfile::lexical_analyzer_t<cfgfile::string_trait_t>::is_space_char
          (lexical_analyzer_t<cfgfile::string_trait_t> *this,char_t ch)

{
  char_t ch_local;
  lexical_analyzer_t<cfgfile::string_trait_t> *this_local;
  undefined1 local_1;
  
  if ((((ch == const_t<cfgfile::string_trait_t>::c_space) ||
       (ch == const_t<cfgfile::string_trait_t>::c_tab)) ||
      (ch == const_t<cfgfile::string_trait_t>::c_carriage_return)) ||
     (ch == const_t<cfgfile::string_trait_t>::c_line_feed)) {
    local_1 = true;
  }
  else {
    local_1 = false;
  }
  return local_1;
}

Assistant:

bool is_space_char( typename Trait::char_t ch )
	{
		if( ch == const_t< Trait >::c_space || ch == const_t< Trait >::c_tab ||
			ch == const_t< Trait >::c_carriage_return ||
			ch == const_t< Trait >::c_line_feed )
				return true;
		else
			return false;
	}